

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O3

int testSpanTestsIteratorImmutableExplicitRBeginREnd(void)

{
  long lVar1;
  pointer piVar2;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> values;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> local_30;
  int local_18 [4];
  
  local_18[0] = 1;
  local_18[1] = 2;
  local_18[2] = 3;
  local_18[3] = 4;
  __l._M_len = 4;
  __l._M_array = local_18;
  std::vector<int,_std::allocator<int>_>::vector(&local_30,__l,&local_31);
  piVar2 = (pointer)0x0;
  if ((long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    piVar2 = local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  }
  iVar5 = 5;
  lVar4 = (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  do {
    if (lVar4 == 0) {
      iVar6 = 0;
      if (iVar5 != 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                   ,0x71);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x153);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(counter) == (0)",0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        iVar6 = 1;
        std::ostream::flush();
      }
      goto LAB_001be0bc;
    }
    iVar5 = iVar5 + -1;
    lVar1 = lVar4 + -4;
    lVar4 = lVar4 + -4;
  } while (iVar5 == *(int *)((long)piVar2 + lVar1));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
             ,0x71);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x151);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(*itr) == (counter--)",0x15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  iVar6 = 1;
  std::ostream::flush();
LAB_001be0bc:
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar6;
}

Assistant:

int testSpanTestsIteratorImmutableExplicitRBeginREnd()
{
    const std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    int counter = 4;
    for (auto itr = span.rbegin(); itr != span.rend(); ++itr) {
        static_assert(std::is_same<decltype(*itr), const int&>::value, "iterator must be const");
        ML_ASSERT_EQ(*itr, counter--);
    }
    ML_ASSERT_EQ(counter, 0);

    return 0;
}